

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_matrix.cpp
# Opt level: O2

ostream * operator<<(ostream *out,ExtendedMatrix *matrix)

{
  string local_30;
  
  if (Options::output_type == 1) {
    ExtendedMatrix::ToLaTex_abi_cxx11_(&local_30,matrix);
    std::operator<<(out,(string *)&local_30);
  }
  else {
    if (Options::output_type != 0) {
      return out;
    }
    ExtendedMatrix::ToString_abi_cxx11_(&local_30,matrix);
    std::operator<<(out,(string *)&local_30);
  }
  std::__cxx11::string::~string((string *)&local_30);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const ExtendedMatrix& matrix) {
  if (Options::output_type == Options::OutputType::Standard) {
    out << matrix.ToString();
  } else if (Options::output_type == Options::OutputType::LaTex){
    out << matrix.ToLaTex();
  }

  return out;
}